

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code llvm::sys::fs::copy_file(Twine *From,int ToFD)

{
  uint uVar1;
  undefined8 in_RAX;
  error_code eVar3;
  int ReadFD;
  int local_24;
  error_category *peVar2;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  eVar3 = openFileForRead(From,&local_24,F_None,(SmallVectorImpl<char> *)0x0);
  peVar2 = eVar3._M_cat;
  uVar1 = eVar3._M_value;
  if (uVar1 == 0) {
    eVar3 = copy_file_internal(local_24,ToFD);
    peVar2 = eVar3._M_cat;
    uVar1 = eVar3._M_value;
    close(local_24);
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = uVar1;
  eVar3._M_cat = peVar2;
  return eVar3;
}

Assistant:

std::error_code copy_file(const Twine &From, int ToFD) {
  int ReadFD;
  if (std::error_code EC = openFileForRead(From, ReadFD, OF_None))
    return EC;

  std::error_code EC = copy_file_internal(ReadFD, ToFD);

  close(ReadFD);

  return EC;
}